

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::reparse_expr(Plotter *this,size_t idx)

{
  Function *func;
  Expr *this_00;
  pointer pcVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pEVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint64_t uVar9;
  undefined7 extraout_var;
  long lVar10;
  undefined8 *puVar11;
  uint32_t *puVar12;
  pointer pFVar13;
  long *plVar14;
  char cVar15;
  size_type *psVar16;
  char *pcVar17;
  pointer pFVar18;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ulong uVar19;
  _Alloc_hider _Var20;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *this_01;
  undefined1 *puVar21;
  Environment *pEVar22;
  byte bVar23;
  Expr *point_expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  string *expr;
  pointer this_02;
  size_t sVar25;
  string_view expr_00;
  string_view expr_01;
  initializer_list<unsigned_long> __l;
  string funname;
  string arg;
  string lhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  uint64_t addr;
  string rhs;
  string local_148;
  Environment *local_120;
  uint local_114;
  string *local_110;
  long local_108;
  string local_100;
  string local_e0;
  uint32_t *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  size_t local_50;
  Expr local_48;
  
  paVar24 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar24;
  local_50 = idx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"x","");
  pEVar22 = &this->env;
  uVar9 = Environment::addr_of(pEVar22,&local_e0,false);
  this->x_var = (uint32_t)uVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar24) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"y","");
  uVar9 = Environment::addr_of(pEVar22,&local_e0,false);
  this->y_var = (uint32_t)uVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar24) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"t","");
  uVar9 = Environment::addr_of(pEVar22,&local_e0,false);
  this->t_var = (uint32_t)uVar9;
  local_120 = pEVar22;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar24) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  sVar25 = local_50;
  pFVar13 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->func_error)._M_dataplus._M_p;
  func = pFVar13 + local_50;
  (this->func_error)._M_string_length = 0;
  *pcVar1 = '\0';
  this_01 = &pFVar13[local_50].exprs;
  std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::_M_erase_at_end
            (this_01,(this_01->super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (this->use_latex == true) {
    nivalis::latex_to_nivalis(&local_148,&pFVar13[sVar25].expr_str);
  }
  else {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    pcVar1 = (func->expr_str)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar1,pcVar1 + (func->expr_str)._M_string_length);
  }
  iVar8 = anon_unknown_10::detect_func_type
                    ((anon_unknown_10 *)local_148._M_dataplus._M_p,
                     (string *)local_148._M_string_length,&local_e0,&local_70);
  func->type = iVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,(ulong)(local_148.field_2._M_allocated_capacity + 1))
    ;
  }
  local_110 = &this->func_error;
  local_114 = func->type & 0xfffffff8;
  local_108 = 0;
  switch((uint)func->type >> 3) {
  case 0:
  case 1:
  case 3:
    if (local_70._M_string_length == 1) {
      if (local_114 == 0) {
        cVar15 = 'y';
      }
      else if (local_114 == 0x18) {
        cVar15 = 'r';
      }
      else if (local_114 == 8) {
        cVar15 = 'x';
      }
      else {
        cVar15 = '\0';
      }
      expr = &local_e0;
      if (*local_70._M_dataplus._M_p != cVar15) goto LAB_001280fb;
    }
    else {
LAB_001280fb:
      expr = &local_70;
    }
    parse((Expr *)&local_148,expr,local_120,true,true,0,local_110);
    pAVar2 = (func->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (func->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_148.field_2._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if ((pAVar2 != (pointer)0x0) &&
       (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_148._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      uVar19 = local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p;
      _Var20._M_p = local_148._M_dataplus._M_p;
LAB_001283ea:
      operator_delete(_Var20._M_p,uVar19);
    }
    goto LAB_001283ef;
  case 2:
    std::operator+(&local_b8,"(",&local_e0);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_90.field_2._M_allocated_capacity = *psVar16;
      local_90.field_2._8_8_ = plVar14[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar16;
      local_90._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_90._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    psVar16 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_100.field_2._M_allocated_capacity = *psVar16;
      local_100.field_2._8_8_ = plVar14[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar16;
      local_100._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_100._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar24) {
      local_148.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_148.field_2._8_8_ = puVar11[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_148._M_string_length = *(size_type *)(puVar11 + 1);
    *puVar11 = paVar24;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    parse(&local_48,&local_148,local_120,true,true,0,local_110);
    pAVar2 = (func->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (func->expr).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.ast.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_start;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.ast.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (func->expr).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.ast.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_48.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pAVar2 != (pointer)0x0) &&
       (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
       local_48.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_48.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.ast.
                            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar19 = local_b8.field_2._M_allocated_capacity + 1;
      _Var20._M_p = local_b8._M_dataplus._M_p;
      goto LAB_001283ea;
    }
LAB_001283ef:
    local_108 = 0;
    break;
  case 8:
    lVar10 = std::__cxx11::string::find((char)&local_e0,0x28);
    std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
    util::trim(&local_148);
    puVar21 = (undefined1 *)(lVar10 + 1);
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    pEVar22 = local_120;
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_string_length;
    if (puVar21 < (undefined1 *)
                  ((long)&((string *)(local_e0._M_string_length + -0x10))->_M_string_length + 7U)) {
      lVar10 = 0;
      local_108 = 0;
      local_c0 = (uint32_t *)puVar21;
      bVar7 = false;
      do {
        cVar15 = local_e0._M_dataplus._M_p[(long)puVar21];
        bVar5 = bVar7;
        if (cVar15 == ',') {
          if (lVar10 == 0) {
            std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
            util::trim(&local_100);
            expr_00._M_str = extraout_RDX;
            expr_00._M_len = (size_t)local_100._M_dataplus._M_p;
            bVar6 = util::is_varname((util *)local_100._M_string_length,expr_00);
            bVar5 = true;
            if (bVar6) {
              local_90._M_dataplus._M_p = (pointer)Environment::addr_of(local_120,&local_100,false);
              if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                           (iterator)local_b8._M_string_length,(unsigned_long *)&local_90);
              }
              else {
                *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
                local_b8._M_string_length = local_b8._M_string_length + 8;
              }
              local_c0 = (uint32_t *)(puVar21 + 1);
              bVar5 = bVar7;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar6) break;
            lVar10 = 0;
            paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0._M_string_length;
          }
        }
        else if (cVar15 == ')') {
          lVar10 = lVar10 + -1;
        }
        else if (cVar15 == '(') {
          lVar10 = lVar10 + 1;
        }
        else {
          iVar8 = isspace((int)cVar15);
          local_108 = local_108 + (ulong)(iVar8 == 0);
        }
        puVar21 = puVar21 + 1;
        bVar7 = bVar5;
      } while (puVar21 < (undefined1 *)((long)&((string *)(paVar24 + -1))->_M_string_length + 7U));
      pEVar22 = local_120;
      paVar24 = &local_100.field_2;
      if ((!bVar5) && (local_108 != 0)) {
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
        util::trim(&local_148);
        expr_01._M_str = extraout_RDX_00;
        expr_01._M_len = (size_t)local_100._M_dataplus._M_p;
        bVar6 = util::is_varname((util *)local_100._M_string_length,expr_01);
        bVar7 = true;
        if (bVar6) {
          local_90._M_dataplus._M_p = (pointer)Environment::addr_of(pEVar22,&local_100,false);
          bVar7 = bVar5;
          if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                       (iterator)local_b8._M_string_length,(unsigned_long *)&local_90);
          }
          else {
            *(pointer *)local_b8._M_string_length = local_90._M_dataplus._M_p;
            local_b8._M_string_length = local_b8._M_string_length + 8;
          }
        }
        bVar5 = bVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar24) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar5) goto LAB_00128933;
      std::operator+(&local_90,"Invalid argument name in function definition ",&local_e0);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
      psVar16 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_100.field_2._M_allocated_capacity = *psVar16;
        local_100.field_2._8_8_ = plVar14[3];
        local_100._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar16;
        local_100._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_100._M_string_length = plVar14[1];
      *plVar14 = (long)psVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_110,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar24) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      lVar10 = 0;
    }
    else {
LAB_00128933:
      parse((Expr *)&local_100,&local_70,pEVar22,true,true,0,local_110);
      uVar9 = Environment::addr_of_func(pEVar22,&local_148);
      lVar10 = CONCAT71((int7)((ulong)paVar24 >> 8),uVar9 == 0xffffffffffffffff);
      Environment::def_func
                (pEVar22,&local_148,(Expr *)&local_100,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
      if ((this->env).error_msg._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)local_110);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_100._M_dataplus._M_p,
                        local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_b8._M_dataplus._M_p,
                      local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
    }
    local_108 = lVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    break;
  case 0x10:
  case 0x11:
    bVar7 = anon_unknown_10::parse_polyline_expr
                      (&local_e0,func,local_120,this->x_var,this->y_var,this->t_var,local_110);
    local_108 = CONCAT71(extraout_var,bVar7);
    if ((local_114 == 0x88) &&
       ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x60)) {
      std::__cxx11::string::_M_replace
                ((ulong)local_110,0,(char *)(this->func_error)._M_string_length,0x21b010);
    }
    break;
  case 0x12:
    lVar10 = std::__cxx11::string::find((char)&local_e0,0x40);
    if (lVar10 == -1) {
      pcVar17 = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      anon_unknown_10::parse_polyline_expr
                (&local_148,func,local_120,this->x_var,this->y_var,this->t_var,local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      parse((Expr *)&local_100,&local_148,local_120,true,true,0,local_110);
      std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::emplace_back<nivalis::Expr>
                (this_01,(Expr *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_100._M_dataplus._M_p,
                        local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x48) goto LAB_001283ef;
      pcVar17 = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
    }
    local_108 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)local_110,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar17);
    break;
  case 0x13:
    lVar10 = std::__cxx11::string::find((char)&local_e0,0x40);
    if (lVar10 == -1) {
      pcVar17 = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      pEVar22 = local_120;
      anon_unknown_10::parse_polyline_expr
                (&local_148,func,local_120,this->x_var,this->y_var,this->t_var,local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      anon_unknown_10::parse_polyline_expr
                (&local_148,func,pEVar22,this->x_var,this->y_var,this->t_var,local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) goto LAB_001283ef;
      pcVar17 = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
    }
    local_108 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)local_110,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar17);
    break;
  case 0x14:
    lVar10 = std::__cxx11::string::find((char)&local_e0,0x40);
    if (lVar10 == -1) {
      pcVar17 = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      anon_unknown_10::parse_polyline_expr
                (&local_148,func,local_120,this->x_var,this->y_var,this->t_var,local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_e0);
      std::__cxx11::string::operator=((string *)&func->str,(string *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      util::trim(&func->str);
      if ((long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x30) goto LAB_001283ef;
      pcVar17 = "Illegal %text. Syntax: %text text @ (x, y)\n";
    }
    local_108 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)local_110,0,(char *)(this->func_error)._M_string_length,(ulong)pcVar17);
  }
  this_00 = &func->expr;
  bVar7 = Expr::is_null(this_00);
  local_c0 = &this->y_var;
  if (bVar7) {
    Expr::ASTNode::ASTNode((ASTNode *)&local_148,null);
    pAVar2 = (func->diff).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)pAVar2 = local_148._M_dataplus._M_p;
    pAVar2->field_1 = (anon_union_8_3_343d95dd_for_ASTNode_1)local_148._M_string_length;
  }
  else if (((local_114 != 0x28) && (local_114 != 0x40)) &&
          ((Expr::optimize(this_00,5), puVar12 = local_c0, local_114 == 8 ||
           (puVar12 = &this->x_var, local_114 == 0)))) {
    uVar19 = (ulong)*puVar12;
    Expr::diff((Expr *)&local_148,this_00,uVar19,local_120);
    pAVar2 = (func->diff).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (func->diff).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (func->diff).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
    (func->diff).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
    (func->diff).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_148.field_2._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if ((pAVar2 != (pointer)0x0) &&
       (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
       (pointer)local_148._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    bVar7 = Expr::is_null(&func->diff);
    if (bVar7) {
      Expr::ASTNode::ASTNode((ASTNode *)&local_148,null);
      pAVar2 = (func->ddiff).ast.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)pAVar2 = local_148._M_dataplus._M_p;
      (pAVar2->field_1).ref = local_148._M_string_length;
    }
    else {
      Expr::diff((Expr *)&local_148,&func->diff,uVar19,local_120);
      pAVar2 = (func->ddiff).ast.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar3 = (func->ddiff).ast.
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (func->ddiff).ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
      (func->ddiff).ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
      (func->ddiff).ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_148.field_2._M_allocated_capacity;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
      if ((pAVar2 != (pointer)0x0) &&
         (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
         (pointer)local_148._M_dataplus._M_p != (pointer)0x0)) {
        operator_delete(local_148._M_dataplus._M_p,
                        local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
      }
    }
    Expr::constant((Expr *)&local_100,1.0);
    Expr::operator/((Expr *)&local_148,(Expr *)&local_100,this_00);
    pAVar2 = (func->recip).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (func->recip).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (func->recip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
    (func->recip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
    (func->recip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_148.field_2._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if ((pAVar2 != (pointer)0x0) &&
       (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
       (pointer)local_148._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_100._M_dataplus._M_p,
                      local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
    }
    Expr::optimize(&func->recip,5);
    Expr::diff((Expr *)&local_148,&func->recip,uVar19,local_120);
    pAVar2 = (func->drecip).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (func->drecip).ast.
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (func->drecip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_148._M_dataplus._M_p;
    (func->drecip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_148._M_string_length;
    (func->drecip).ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_148.field_2._M_allocated_capacity;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
    if ((pAVar2 != (pointer)0x0) &&
       (operator_delete(pAVar2,(long)pAVar3 - (long)pAVar2),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_148._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
  }
  pEVar4 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_02 = (func->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_02 != pEVar4; this_02 = this_02 + 1)
  {
    Expr::optimize(this_02,5);
  }
  if ((local_114 == 0) || (local_114 == 8)) {
    uVar9 = Environment::addr_of_func(local_120,&func->name);
    puVar12 = &this->x_var;
    if (local_114 == 8) {
      puVar12 = local_c0;
    }
    local_100._M_dataplus._M_p = (pointer)(ulong)*puVar12;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_100;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,__l,
               (allocator_type *)&local_90);
    Environment::def_func
              (local_120,&func->name,this_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    bVar23 = uVar9 == 0xffffffffffffffff | (byte)local_108;
    if ((this->env).error_msg._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)local_110);
    }
LAB_001287df:
    if (bVar23 == 0) goto LAB_00128831;
  }
  else {
    if (local_114 == 0x40) {
      bVar23 = (byte)local_108;
      goto LAB_001287df;
    }
    uVar9 = Environment::addr_of_func(local_120,&func->name);
    bVar23 = (byte)local_108;
    if (uVar9 == 0xffffffffffffffff) goto LAB_001287df;
    Environment::del_func(local_120,&func->name);
  }
  pFVar13 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar18 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar18 != pFVar13) {
    sVar25 = 0;
    do {
      if (local_50 != sVar25) {
        reparse_expr(this,sVar25);
        pFVar13 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar18 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      sVar25 = sVar25 + 1;
    } while (sVar25 < (ulong)(((long)pFVar18 - (long)pFVar13 >> 4) * -0x79435e50d79435e5));
  }
LAB_00128831:
  this->loss_detail = false;
  this->require_update = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Plotter::reparse_expr(size_t idx) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    auto& func = funcs[idx];
    func_error.clear();
    func.exprs.clear();
    std::string lhs, rhs;
    func.type = detect_func_type(use_latex ? latex_to_nivalis(func.expr_str) : func.expr_str, lhs, rhs);

    int ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
    bool want_reparse_all = false;
    switch(ftype_nomod) {
        case Function::FUNC_TYPE_EXPLICIT:
        case Function::FUNC_TYPE_EXPLICIT_Y:
        case Function::FUNC_TYPE_POLAR:
            func.expr = parse((rhs.size() == 1 &&
                            rhs[0] == result_var_name_for_type(func.type)) ?
                            lhs : rhs,
                        env,
                        true, // mode explicit
                        true, // quiet
                        0, &func_error);
            break;
        case Function::FUNC_TYPE_IMPLICIT:
            func.expr = parse("(" + lhs + ")-(" + rhs + ")",
                    env, true, true, 0, &func_error);
            break;
        case Function::FUNC_TYPE_GEOM_POLYLINE:
        case Function::FUNC_TYPE_GEOM_RECT:
            // This is either polyline or parametric
            {
                // New variable may have been registered implicitly:
                // (a,b) creates variables a,b
                // so possibly have to reparse all
                want_reparse_all = parse_polyline_expr(lhs, func, env,
                        x_var, y_var, t_var, func_error);
                if (ftype_nomod == Function::FUNC_TYPE_GEOM_RECT && func.exprs.size() != 4) {
                    func_error = "Illegal %rect. Syntax: %rect (ax, ay) (bx, by)\n";
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_CIRCLE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.exprs.push_back(parse(lhs.substr(0, rad_end_pos), env, true, true, 0, &func_error));
                    if (func.exprs.size() != 3) {
                        func_error = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_ELLIPSE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    parse_polyline_expr(lhs.substr(0, rad_end_pos), func, env,
                            x_var, y_var, t_var, func_error);
                    if (func.exprs.size() != 4) {
                        func_error = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_TEXT:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.str = lhs.substr(0, rad_end_pos);
                    util::trim(func.str);
                    if (func.exprs.size() != 2) {
                        func_error = "Illegal %text. Syntax: %text text @ (x, y)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_FUNC_DEFINITION:
            {
                size_t funname_end = lhs.find('(');
                std::string funname = lhs.substr(0, funname_end);
                util::trim(funname);
                int64_t stkh = 0, last_begin = funname_end + 1;
                size_t argcount = 0, non_space_count = 0;
                std::vector<uint64_t> bindings;
                bool bad = false;
                for (int64_t i = funname_end + 1; i < lhs.size()- 1; ++i) {
                    const char cc = lhs[i];
                    if (cc == '(') {
                        ++stkh;
                    } else if (cc == ')') {
                        --stkh;
                    } else if (cc == ',') {
                        if (stkh == 0) {
                            std::string arg = lhs.substr(last_begin, i - last_begin);
                            util::trim(arg);
                            if (!util::is_varname(arg)) {
                                bad = true;
                                break;
                            }
                            auto addr = env.addr_of(arg, false);
                            bindings.push_back(addr);
                            last_begin = i+1;
                            ++argcount;
                        }
                    } else if (!std::isspace(cc)) {
                        ++non_space_count;
                    }
                }
                if (!bad && non_space_count) {
                    ++argcount;
                    std::string arg = lhs.substr(last_begin, lhs.size() - last_begin - 1);
                    util::trim(funname);
                    if (!util::is_varname(arg)) {
                        bad = true;
                    } else {
                        auto addr = env.addr_of(arg, false);
                        bindings.push_back(addr);
                    }
                } // else: function call with no args
                if (bad) {
                    func_error = "Invalid argument name in function definition " + lhs + "\n";
                } else {
                    Expr expr = parse(rhs, env, true, true, 0, &func_error);
                    if (env.addr_of_func(funname) == -1) {
                        // Since new function defined, other expressions may change meaning,
                        // so must reparse all
                        want_reparse_all = true;
                    }
                    auto addr = env.def_func(funname, expr, bindings);
                    if (env.error_msg.size()) {
                        func_error = env.error_msg;
                    }
                }
            }
            break;
    }

    if (!func.expr.is_null()) {
        // Optimize the main expression
        if (ftype_nomod != Function::FUNC_TYPE_PARAMETRIC &&
            ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION)
            func.expr.optimize();

        // Compute derivatives, if explicit
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
            ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
            func.diff = func.expr.diff(var, env);
            if (!func.diff.is_null()) {
                func.ddiff = func.diff.diff(var, env);
            }
            else func.ddiff.ast[0] = OpCode::null;
            func.recip = Expr::constant(1.) / func.expr;
            func.recip.optimize();
            func.drecip = func.recip.diff(var, env);
        }
    } else func.diff.ast[0] = OpCode::null;

    // Optimize any polyline/parametric point expressions
    for (auto& point_expr : func.exprs) {
        point_expr.optimize();
    }

    if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT
        || ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
        if (env.addr_of_func(func.name) == -1) {
            want_reparse_all = true;
        }
        // Register a function in env
        env.def_func(func.name, func.expr, { ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ? y_var : x_var });
        if (env.error_msg.size()) {
            func_error = env.error_msg;
        }
    } else if (ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION) {
        if (env.addr_of_func(func.name) != -1) {
            env.del_func(func.name);
            want_reparse_all = true;
        }
    }

    if (want_reparse_all) {
        // Possibly re-parse other expressions
        for (size_t i = 0; i < funcs.size(); ++i) {
            if (i != idx) {
                reparse_expr(i);
            }
        }
    }
    loss_detail = false;
    require_update = true;
}